

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O0

DistanceEntry * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetDistanceEntryForSubscriptPair
          (LoopDependenceAnalysis *this,
          pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair,
          DistanceVector *distance_vector)

{
  Loop *loop_00;
  DistanceEntry *pDVar1;
  Loop *loop;
  DistanceVector *distance_vector_local;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair_local;
  LoopDependenceAnalysis *this_local;
  
  loop_00 = GetLoopForSubscriptPair(this,subscript_pair);
  pDVar1 = GetDistanceEntryForLoop(this,loop_00,distance_vector);
  return pDVar1;
}

Assistant:

DistanceEntry* LoopDependenceAnalysis::GetDistanceEntryForSubscriptPair(
    const std::pair<SENode*, SENode*>& subscript_pair,
    DistanceVector* distance_vector) {
  const Loop* loop = GetLoopForSubscriptPair(subscript_pair);

  return GetDistanceEntryForLoop(loop, distance_vector);
}